

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local.c
# Opt level: O1

void local_proxy_opener_coroutine(void *vctx)

{
  Conf *pCVar1;
  SeatPromptResult spr_00;
  char *pcVar2;
  prompts_t *ppVar3;
  InteractionReadySeat IVar4;
  strbuf *buf_o;
  size_t sVar5;
  char *ptr;
  ptrlen pl;
  ptrlen str;
  uint flags;
  SeatPromptResult spr;
  byte local_44 [4];
  SeatPromptResultKind in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  _func_void_SeatPromptResult_BinarySink_ptr *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  
  if (*vctx == 0xa9) {
LAB_0013e42e:
    IVar4 = interactor_announce((Interactor *)((long)vctx + 0x60));
    (*(IVar4.seat)->vt->get_userpass_input)
              ((SeatPromptResult *)&stack0xffffffffffffffc0,IVar4.seat,
               *(prompts_t **)((long)vctx + 0x50));
    if (in_stack_ffffffffffffffc0 != SPRK_OK) {
      if (in_stack_ffffffffffffffc0 == SPRK_SW_ABORT) {
        if (*(long *)((long)vctx + 0x48) != 0) {
          interactor_return_seat(*(Interactor **)((long)vctx + 0x38));
          *(undefined8 *)((long)vctx + 0x38) = 0;
          *(undefined8 *)((long)vctx + 0x48) = 0;
        }
        spr_00._4_4_ = in_stack_ffffffffffffffc4;
        spr_00.kind = in_stack_ffffffffffffffc0;
        spr_00.errfn = in_stack_ffffffffffffffc8;
        spr_00.errdata_lit = in_stack_ffffffffffffffd0;
        spr_00.errdata_u = (uint)in_stack_ffffffffffffffd8;
        spr_00._28_4_ = SUB84(in_stack_ffffffffffffffd8,4);
        pcVar2 = spr_get_error_message(spr_00);
        (**(code **)(**(long **)((long)vctx + 0x18) + 8))(*(long **)((long)vctx + 0x18),1,pcVar2);
        safefree(pcVar2);
        return;
      }
      if (in_stack_ffffffffffffffc0 == SPRK_USER_ABORT) {
        if (*(long *)((long)vctx + 0x48) != 0) {
          interactor_return_seat(*(Interactor **)((long)vctx + 0x38));
          *(undefined8 *)((long)vctx + 0x38) = 0;
          *(undefined8 *)((long)vctx + 0x48) = 0;
        }
        (**(code **)(**(long **)((long)vctx + 0x18) + 8))
                  (*(long **)((long)vctx + 0x18),3,"User aborted connection setup");
        return;
      }
      *(undefined4 *)vctx = 0xa9;
      return;
    }
    if ((long)*(int *)((long)vctx + 0x58) != -1) {
      pCVar1 = *(Conf **)((long)vctx + 0x30);
      pcVar2 = prompt_get_result_ref
                         (*(prompt_t **)
                           (*(long *)(*(long *)((long)vctx + 0x50) + 0x38) +
                           (long)*(int *)((long)vctx + 0x58) * 8));
      conf_set_str(pCVar1,0x10,pcVar2);
    }
    if ((long)*(int *)((long)vctx + 0x5c) != -1) {
      pCVar1 = *(Conf **)((long)vctx + 0x30);
      pcVar2 = prompt_get_result_ref
                         (*(prompt_t **)
                           (*(long *)(*(long *)((long)vctx + 0x50) + 0x38) +
                           (long)*(int *)((long)vctx + 0x5c) * 8));
      conf_set_str(pCVar1,0x11,pcVar2);
    }
    free_prompts(*(prompts_t **)((long)vctx + 0x50));
    *(undefined8 *)((long)vctx + 0x50) = 0;
  }
  else {
    if (*vctx != 0) goto LAB_0013e658;
    pcVar2 = format_telnet_command
                       (*(SockAddr **)((long)vctx + 0x20),*(int *)((long)vctx + 0x28),
                        *(Conf **)((long)vctx + 0x30),(uint *)local_44);
    *(char **)((long)vctx + 0x10) = pcVar2;
    if ((*(long *)((long)vctx + 0x48) != 0) && ((local_44[0] & 3) != 0)) {
      burnstr(pcVar2);
      *(undefined8 *)((long)vctx + 0x10) = 0;
      ppVar3 = new_prompts();
      *(prompts_t **)((long)vctx + 0x50) = ppVar3;
      ppVar3->callback = local_proxy_opener_coroutine;
      ppVar3->callback_ctx = vctx;
      ppVar3->to_server = true;
      ppVar3->from_server = false;
      pcVar2 = dupstr("Local proxy authentication");
      ppVar3 = *(prompts_t **)((long)vctx + 0x50);
      ppVar3->name = pcVar2;
      if ((local_44[0] & 1) == 0) {
        *(undefined4 *)((long)vctx + 0x58) = 0xffffffff;
      }
      else {
        *(int *)((long)vctx + 0x58) = (int)ppVar3->n_prompts;
        pcVar2 = dupstr("Proxy username: ");
        add_prompt(ppVar3,pcVar2,true);
      }
      if ((local_44[0] & 2) == 0) {
        *(undefined4 *)((long)vctx + 0x5c) = 0xffffffff;
      }
      else {
        ppVar3 = *(prompts_t **)((long)vctx + 0x50);
        *(int *)((long)vctx + 0x5c) = (int)ppVar3->n_prompts;
        pcVar2 = dupstr("Proxy password: ");
        add_prompt(ppVar3,pcVar2,false);
      }
      goto LAB_0013e42e;
    }
  }
  pcVar2 = format_telnet_command
                     (*(SockAddr **)((long)vctx + 0x20),*(int *)((long)vctx + 0x28),
                      *(Conf **)((long)vctx + 0x30),(uint *)0x0);
  *(char **)((long)vctx + 0x10) = pcVar2;
  conf_set_str(*(Conf **)((long)vctx + 0x30),0x11,"*password*");
  pcVar2 = format_telnet_command
                     (*(SockAddr **)((long)vctx + 0x20),*(int *)((long)vctx + 0x28),
                      *(Conf **)((long)vctx + 0x30),(uint *)0x0);
  buf_o = strbuf_new();
  pl.len = 0x1e;
  pl.ptr = "Starting local proxy command: ";
  BinarySink_put_datapl(buf_o->binarysink_,pl);
  sVar5 = strlen(pcVar2);
  str.len = sVar5;
  str.ptr = pcVar2;
  BinarySink_put_c_string_literal(buf_o->binarysink_,str);
  (**(code **)**(undefined8 **)((long)vctx + 0x18))
            (*(undefined8 **)((long)vctx + 0x18),3,0,0,buf_o->s,0);
  strbuf_free(buf_o);
  safefree(pcVar2);
  pcVar2 = *(char **)((long)vctx + 0x10);
  *(undefined8 *)((long)vctx + 0x10) = 0;
  if (*(long *)((long)vctx + 0x48) != 0) {
    interactor_return_seat(*(Interactor **)((long)vctx + 0x38));
    *(undefined8 *)((long)vctx + 0x38) = 0;
    *(undefined8 *)((long)vctx + 0x48) = 0;
  }
  ptr = platform_setup_local_proxy(*(Socket **)((long)vctx + 8),pcVar2);
  burnstr(pcVar2);
  if (ptr == (char *)0x0) {
    return;
  }
  (**(code **)(**(long **)((long)vctx + 0x18) + 8))(*(long **)((long)vctx + 0x18),1,ptr);
  safefree(ptr);
LAB_0013e658:
  *(undefined4 *)vctx = 0;
  return;
}

Assistant:

static void local_proxy_opener_coroutine(void *vctx)
{
    LocalProxyOpener *lp = (LocalProxyOpener *)vctx;

    crBegin(lp->crLine);

    /*
     * Make an initial attempt to figure out the command we want, and
     * see if it tried to include a username or password that we don't
     * have.
     */
    {
        unsigned flags;
        lp->formatted_cmd = format_telnet_command(
            lp->addr, lp->port, lp->conf, &flags);

        if (lp->clientseat && (flags & (TELNET_CMD_MISSING_USERNAME |
                                        TELNET_CMD_MISSING_PASSWORD))) {
            burnstr(lp->formatted_cmd);
            lp->formatted_cmd = NULL;

            /*
             * We're missing at least one of the two parts, and we
             * have an Interactor we can use to prompt for them, so
             * try it.
             */
            lp->prompts = new_prompts();
            lp->prompts->callback = local_proxy_opener_coroutine;
            lp->prompts->callback_ctx = lp;
            lp->prompts->to_server = true;
            lp->prompts->from_server = false;
            lp->prompts->name = dupstr("Local proxy authentication");
            if (flags & TELNET_CMD_MISSING_USERNAME) {
                lp->username_prompt_index = lp->prompts->n_prompts;
                add_prompt(lp->prompts, dupstr("Proxy username: "), true);
            } else {
                lp->username_prompt_index = -1;
            }
            if (flags & TELNET_CMD_MISSING_PASSWORD) {
                lp->password_prompt_index = lp->prompts->n_prompts;
                add_prompt(lp->prompts, dupstr("Proxy password: "), false);
            } else {
                lp->password_prompt_index = -1;
            }

            while (true) {
                SeatPromptResult spr = seat_get_userpass_input(
                    interactor_announce(&lp->interactor), lp->prompts);
                if (spr.kind == SPRK_OK) {
                    break;
                } else if (spr.kind == SPRK_USER_ABORT) {
                    local_proxy_opener_cleanup_interactor(lp);
                    plug_closing_user_abort(lp->plug);
                    /* That will have freed us, so we must just return
                     * without calling any crStop */
                    return;
                } else if (spr.kind == SPRK_SW_ABORT) {
                    local_proxy_opener_cleanup_interactor(lp);
                    char *err = spr_get_error_message(spr);
                    plug_closing_error(lp->plug, err);
                    sfree(err);
                    return; /* without crStop, as above */
                }
                crReturnV;
            }

            if (lp->username_prompt_index != -1) {
                conf_set_str(
                    lp->conf, CONF_proxy_username,
                    prompt_get_result_ref(
                        lp->prompts->prompts[lp->username_prompt_index]));
            }

            if (lp->password_prompt_index != -1) {
                conf_set_str(
                    lp->conf, CONF_proxy_password,
                    prompt_get_result_ref(
                        lp->prompts->prompts[lp->password_prompt_index]));
            }

            free_prompts(lp->prompts);
            lp->prompts = NULL;
        }

        /*
         * Now format the command a second time, with the results of
         * those prompts written into lp->conf.
         */
        lp->formatted_cmd = format_telnet_command(
            lp->addr, lp->port, lp->conf, NULL);
    }

    /*
     * Log the command, with some changes. Firstly, we regenerate it
     * with the password masked; secondly, we escape control
     * characters so that the log message is printable.
     */
    conf_set_str(lp->conf, CONF_proxy_password, "*password*");
    {
        char *censored_cmd = format_telnet_command(
            lp->addr, lp->port, lp->conf, NULL);

        strbuf *logmsg = strbuf_new();
        put_datapl(logmsg, PTRLEN_LITERAL("Starting local proxy command: "));
        put_c_string_literal(logmsg, ptrlen_from_asciz(censored_cmd));

        plug_log(lp->plug, PLUGLOG_PROXY_MSG, NULL, 0, logmsg->s, 0);
        strbuf_free(logmsg);
        sfree(censored_cmd);
    }

    /*
     * Now we're ready to actually do the platform-specific socket
     * setup.
     */
    char *cmd = lp->formatted_cmd;
    lp->formatted_cmd = NULL;

    local_proxy_opener_cleanup_interactor(lp);

    char *error_msg = platform_setup_local_proxy(lp->socket, cmd);
    burnstr(cmd);

    if (error_msg) {
        plug_closing_error(lp->plug, error_msg);
        sfree(error_msg);
    } else {
        /* If error_msg was NULL, there was no error in setup,
         * which means that platform_setup_local_proxy will have
         * called back to free us. So return without calling any
         * crStop. */
        return;
    }

    crFinishV;
}